

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkUniversal::InjectConstraints(ChLinkUniversal *this,ChSystemDescriptor *descriptor)

{
  int iVar1;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_x);
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_y);
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_z);
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_dot);
    return;
  }
  return;
}

Assistant:

void ChLinkUniversal::InjectConstraints(ChSystemDescriptor& descriptor) {
    if (!IsActive())
        return;

    descriptor.InsertConstraint(&m_cnstr_x);
    descriptor.InsertConstraint(&m_cnstr_y);
    descriptor.InsertConstraint(&m_cnstr_z);
    descriptor.InsertConstraint(&m_cnstr_dot);
}